

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O1

bool __thiscall
ON_NurbsCurve::GetNextDiscontinuity
          (ON_NurbsCurve *this,continuity c,double t0,double t1,double *t,int *hint,int *dtype,
          double cos_angle_tolerance,double curvature_tolerance)

{
  long lVar1;
  double dVar2;
  bool bVar3;
  ON_3dVector Km_00;
  ON_3dVector Km_01;
  ON_3dVector Kp_00;
  ON_3dVector Kp_01;
  long lVar4;
  byte bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  continuity cVar9;
  uint span_index;
  int iVar10;
  int iVar11;
  double *pdVar12;
  byte bVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  double *t_00;
  int iVar18;
  bool bVar19;
  bool bVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  double dVar23;
  double dVar24;
  ON_3dVector Kp;
  ON_3dVector Km;
  ON_3dVector D1p;
  ON_3dVector D1m;
  ON_3dPoint Pm;
  int tmp_dtype;
  int tmp_hint;
  ON_3dVector Tm;
  ON_3dVector Tp;
  ON_3dVector D2p;
  ON_3dVector D2m;
  double tmp_t;
  ON_3dPoint Pp;
  byte local_19c;
  int local_170;
  ON_3dVector local_158;
  ON_3dVector local_138;
  ulong local_120;
  ON_3dVector local_118;
  ON_3dVector local_100;
  ON_3dPoint local_e8;
  int local_d0 [2];
  ON_3dVector local_c8;
  ON_3dVector local_b0;
  ON_3dVector local_98;
  ON_3dVector local_80;
  ON_3dVector local_68;
  double local_50;
  ON_3dPoint local_48;
  
  bVar5 = 0;
  local_d0[1] = 0;
  local_d0[0] = 0;
  local_138.z = ON_3dVector::NanVector.z;
  local_138.x = ON_3dVector::NanVector.x;
  local_138.y = ON_3dVector::NanVector.y;
  local_158.z = ON_3dVector::NanVector.z;
  local_158.x = ON_3dVector::NanVector.x;
  local_158.y = ON_3dVector::NanVector.y;
  if (hint == (int *)0x0) {
    hint = local_d0 + 1;
  }
  if (dtype == (int *)0x0) {
    dtype = local_d0;
  }
  t_00 = &local_50;
  if (t != (double *)0x0) {
    t_00 = t;
  }
  if (c == C0_continuous) goto LAB_0059194c;
  if (c == C0_locus_continuous) {
    c = C0_locus_continuous;
LAB_00590daf:
    bVar5 = ON_Curve::GetNextDiscontinuity
                      (&this->super_ON_Curve,c,t0,t1,t_00,hint,dtype,cos_angle_tolerance,
                       curvature_tolerance);
  }
  else {
    if ((t0 != t1) || (NAN(t0) || NAN(t1))) {
      if (this->m_order < 3) {
        c = ON::PolylineContinuity(c);
      }
      cVar9 = ON::ParametricContinuity(c);
      if (cVar9 < (Gsmooth_continuous|C0_continuous)) {
        uVar16 = 0;
        if ((0x1028U >> (cVar9 & 0x1f) & 1) != 0) {
          uVar16 = (uint)(2 < this->m_order);
        }
      }
      else {
        uVar16 = 0;
      }
      bVar20 = cVar9 == Gsmooth_continuous;
      local_170 = (uVar16 | 2) - this->m_order;
      if (cVar9 == Cinfinity_continuous) {
        local_170 = 0;
      }
      span_index = ON_NurbsSpanIndex(this->m_order,this->m_cv_count,this->m_knot,t0,
                                     (uint)(t0 <= t1) * 2 + -1,*hint);
      pdVar12 = this->m_knot;
      dVar23 = (ABS(pdVar12[(long)(int)span_index + 1] - pdVar12[(int)span_index]) +
               ABS(pdVar12[(long)(int)span_index + 1]) + ABS(pdVar12[(int)span_index])) *
               1.490116119385e-08;
      iVar18 = this->m_order;
      bVar3 = 3 < iVar18;
      iVar10 = span_index + iVar18;
      if (t1 <= t0) {
        if ((((0 < (int)span_index) && (dVar24 = pdVar12[(long)iVar10 + -2], dVar24 < t0)) &&
            (t1 < dVar24)) && (t0 - dVar24 <= dVar23)) {
          span_index = ON_NurbsSpanIndex(iVar18,this->m_cv_count,pdVar12,dVar24,-1,*hint);
          t0 = dVar24;
        }
        if (bVar3 && bVar20) {
          bVar6 = SpanIsLinear(this,span_index,1e-08,1e-08);
        }
        else {
          bVar6 = false;
        }
        *hint = span_index;
        iVar18 = this->m_order + span_index + -2;
        lVar15 = (long)(this->m_order + -2);
        bVar7 = 0 < (int)span_index;
        if ((int)span_index < 1) {
LAB_0059117b:
          iVar10 = 1;
          if (c == cVar9) {
            span_index = 0;
          }
          else {
            span_index = 0;
            if ((this->m_knot[lVar15] < t0) && (t1 < this->m_knot[lVar15])) {
              bVar8 = ON_Curve::GetNextDiscontinuity
                                (&this->super_ON_Curve,c,t0,t1,t_00,hint,dtype,cos_angle_tolerance,
                                 curvature_tolerance);
              iVar10 = 1;
              span_index = (uint)bVar8;
            }
          }
        }
        else {
          if (t0 <= this->m_knot[iVar18]) {
            lVar17 = (long)iVar18 + -1;
            do {
              bVar7 = lVar15 < lVar17;
              if (lVar17 <= lVar15) {
                iVar18 = (int)lVar17;
                goto LAB_0059117b;
              }
              pdVar12 = this->m_knot + lVar17;
              lVar17 = lVar17 + -1;
            } while (t0 <= *pdVar12);
            iVar18 = (int)lVar17 + 1;
          }
          if (!bVar7) goto LAB_0059117b;
          local_170 = -local_170;
          iVar10 = -1;
        }
      }
      else {
        dVar24 = pdVar12[(long)iVar10 + -1];
        if (((t0 < dVar24) && (dVar24 < t1)) &&
           ((dVar24 - t0 <= dVar23 && (iVar10 < this->m_cv_count)))) {
          span_index = ON_NurbsSpanIndex(iVar18,this->m_cv_count,pdVar12,dVar24,1,*hint);
          t0 = dVar24;
        }
        if (bVar3 && bVar20) {
          bVar6 = SpanIsLinear(this,span_index,1e-08,1e-08);
        }
        else {
          bVar6 = false;
        }
        *hint = span_index;
        iVar10 = this->m_order;
        iVar18 = span_index + iVar10 + -2;
        lVar15 = (long)this->m_cv_count + -1;
        iVar11 = (int)lVar15;
        bVar7 = iVar18 < iVar11;
        if (iVar18 < iVar11) {
          lVar17 = (long)iVar18;
          if (this->m_knot[lVar17] <= t0) {
            lVar14 = 0;
            do {
              if ((this->m_cv_count - span_index) - iVar10 == (int)lVar14) {
                bVar7 = lVar17 + lVar14 + 1 < lVar15;
                iVar18 = (int)lVar14 + span_index + iVar10 + -1;
                goto LAB_00591234;
              }
              lVar1 = lVar14 + 1;
              lVar4 = lVar14 + 1;
              lVar14 = lVar1;
            } while (this->m_knot[lVar17 + lVar4] <= t0);
            bVar7 = lVar17 + lVar1 < lVar15;
            iVar18 = iVar18 + (int)lVar1;
          }
          if (!bVar7) goto LAB_00591234;
        }
        else {
LAB_00591234:
          if (c == cVar9) {
            span_index = 0;
          }
          else {
            span_index = 0;
            if ((t0 < this->m_knot[iVar11]) && (this->m_knot[iVar11] <= t1)) {
              bVar8 = ON_Curve::GetNextDiscontinuity
                                (&this->super_ON_Curve,c,t0,t1,t_00,hint,dtype,cos_angle_tolerance,
                                 curvature_tolerance);
              span_index = (uint)bVar8;
            }
          }
        }
        iVar10 = 1;
      }
      bVar5 = (byte)span_index;
      if (!bVar7) goto LAB_0059194c;
      dVar23 = t1;
      if (t0 <= t1) {
        dVar23 = t0;
      }
      pdVar12 = this->m_knot;
      if ((dVar23 < pdVar12[iVar18]) &&
         (dVar24 = (double)(~-(ulong)(t1 < t0) & (ulong)t1 | -(ulong)(t1 < t0) & (ulong)t0),
         pdVar12[iVar18] < dVar24)) {
        local_19c = (byte)uVar16;
        bVar13 = cVar9 != C2_continuous & local_19c;
        local_120 = (ulong)((iVar10 >> 0x1f) + 2);
        do {
          if (iVar10 < 1) {
            lVar15 = (long)this->m_order + -2;
            bVar7 = (int)lVar15 < iVar18;
            if (iVar18 <= (int)lVar15) break;
            lVar17 = (long)iVar18;
            bVar8 = pdVar12[lVar17] == pdVar12[lVar17 + -1];
            bVar19 = NAN(pdVar12[lVar17]) || NAN(pdVar12[lVar17 + -1]);
            while ((bVar8 && (!bVar19))) {
              lVar14 = lVar17 + -1;
              bVar7 = lVar15 < lVar14;
              if (lVar14 <= lVar15) goto LAB_0059190a;
              bVar8 = pdVar12[lVar17 + -1] == pdVar12[lVar17 + -2];
              bVar19 = NAN(pdVar12[lVar17 + -1]) || NAN(pdVar12[lVar17 + -2]);
              lVar17 = lVar14;
            }
            if (!bVar7) break;
          }
          else {
            lVar14 = (long)this->m_cv_count + -1;
            lVar15 = (long)iVar18;
            do {
              lVar17 = lVar15;
              if (lVar14 <= lVar17) goto LAB_0059190a;
            } while ((pdVar12[lVar17] == pdVar12[lVar17 + 1]) &&
                    (lVar15 = lVar17 + 1, !NAN(pdVar12[lVar17]) && !NAN(pdVar12[lVar17 + 1])));
            if (lVar14 <= lVar17) break;
          }
          iVar18 = (int)lVar17;
          dVar2 = pdVar12[iVar18];
          uVar21 = SUB84(dVar2,0);
          uVar22 = (undefined4)((ulong)dVar2 >> 0x20);
          if ((dVar2 != pdVar12[local_170 + iVar18]) ||
             (NAN(dVar2) || NAN(pdVar12[local_170 + iVar18]))) goto LAB_005918e2;
          if (cVar9 == Cinfinity_continuous) {
            *dtype = 3;
LAB_00591943:
            *t_00 = (double)CONCAT44(uVar22,uVar21);
            bVar5 = 1;
            goto LAB_0059194c;
          }
          if (local_19c == 0) {
            ON_Curve::Ev1Der(&this->super_ON_Curve,dVar2,&local_e8,&local_100,-1,hint);
            ON_Curve::Ev1Der(&this->super_ON_Curve,this->m_knot[iVar18],&local_48,&local_118,1,hint)
            ;
          }
          else {
            ON_Curve::Ev2Der(&this->super_ON_Curve,dVar2,&local_e8,&local_100,&local_68,-1,hint);
            ON_Curve::Ev2Der(&this->super_ON_Curve,this->m_knot[iVar18],&local_48,&local_118,
                             &local_80,1,hint);
          }
          if (cVar9 == G1_continuous || bVar13 != 0) {
            if (bVar13 == 0) {
              local_c8.z = local_100.z;
              local_c8.x = local_100.x;
              local_c8.y = local_100.y;
              local_98.x = local_118.x;
              local_98.y = local_118.y;
              local_98.z = local_118.z;
              ON_3dVector::Unitize(&local_c8);
              ON_3dVector::Unitize(&local_98);
            }
            else {
              ON_EvCurvature(&local_100,&local_68,&local_c8,&local_138);
              ON_EvCurvature(&local_118,&local_80,&local_98,&local_158);
            }
            dVar2 = ON_3dVector::operator*(&local_c8,&local_98);
            if (dVar2 < cos_angle_tolerance) {
LAB_00591927:
              *dtype = 1;
              pdVar12 = this->m_knot;
LAB_00591936:
              uVar21 = SUB84(pdVar12[iVar18],0);
              uVar22 = (undefined4)((ulong)pdVar12[iVar18] >> 0x20);
              goto LAB_00591943;
            }
            if (bVar13 == 0) goto LAB_005918e2;
            if (cVar9 == Gsmooth_continuous) {
              Km_00.y = local_138.y;
              Km_00.x = local_138.x;
              Km_00.z = local_138.z;
              Kp_00.y = local_158.y;
              Kp_00.x = local_158.x;
              Kp_00.z = local_158.z;
              bVar7 = ON_IsGsmoothCurvatureContinuous
                                (Km_00,Kp_00,cos_angle_tolerance,curvature_tolerance);
            }
            else {
              Km_01.y = local_138.y;
              Km_01.x = local_138.x;
              Km_01.z = local_138.z;
              Kp_01.y = local_158.y;
              Kp_01.x = local_158.x;
              Kp_01.z = local_158.z;
              bVar7 = ON_IsG2CurvatureContinuous
                                (Km_01,Kp_01,cos_angle_tolerance,curvature_tolerance);
            }
            if (bVar7 == true && cVar9 == Gsmooth_continuous) {
              bVar8 = ON_NurbsArcToArcTransitionIsNotGsmooth
                                (this,iVar18,cos_angle_tolerance,curvature_tolerance);
              bVar7 = (bool)(bVar7 & !bVar8);
            }
            iVar11 = 2;
            if (bVar7 == false) {
LAB_005918b7:
              *dtype = iVar11;
              *t_00 = this->m_knot[iVar18];
              span_index = 1;
              bVar7 = false;
            }
            else {
              bVar7 = true;
              if (bVar3 && bVar20) {
                bVar8 = SpanIsLinear(this,((int)local_120 + iVar18) - this->m_order,1e-08,1e-08);
                iVar11 = 3;
                if (bVar6 != bVar8) goto LAB_005918b7;
              }
            }
            bVar5 = (byte)span_index;
            if (bVar7) goto LAB_005918e2;
            goto LAB_0059194c;
          }
          ON_3dVector::operator-(&local_b0,&local_100,&local_118);
          dVar2 = ON_3dVector::MaximumCoordinate(&local_100);
          bVar7 = ON_3dVector::IsTiny(&local_b0,dVar2 * 1.490116119385e-08);
          if (!bVar7) goto LAB_00591927;
          if (local_19c != 0) {
            ON_3dVector::operator-(&local_b0,&local_68,&local_80);
            dVar2 = ON_3dVector::MaximumCoordinate(&local_68);
            bVar7 = ON_3dVector::IsTiny(&local_b0,dVar2 * 1.490116119385e-08);
            if (bVar7) goto LAB_005918e2;
            *dtype = 2;
            pdVar12 = this->m_knot;
            goto LAB_00591936;
          }
LAB_005918e2:
          iVar18 = iVar18 + iVar10;
          pdVar12 = this->m_knot;
          if ((pdVar12[iVar18] <= dVar23) || (dVar24 <= pdVar12[iVar18])) break;
        } while( true );
      }
LAB_0059190a:
      if (c != cVar9) goto LAB_00590daf;
    }
    bVar5 = 0;
  }
LAB_0059194c:
  return (bool)(bVar5 & 1);
}

Assistant:

bool ON_NurbsCurve::GetNextDiscontinuity( 
                ON::continuity c,
                double t0,
                double t1,
                double* t,
                int* hint,
                int* dtype,
                double cos_angle_tolerance,
                double curvature_tolerance
                ) const
{
  const double is_linear_tolerance = 1.0e-8;  
  const double is_linear_min_length = 1.0e-8;
  int tmp_hint = 0, tmp_dtype=0;
  double d, tmp_t;
  ON_3dPoint Pm, Pp;
  ON_3dVector D1m, D1p, D2m, D2p, Tm, Tp, Km(ON_3dVector::NanVector), Kp(ON_3dVector::NanVector);
  int ki;
  if ( !hint )
    hint = &tmp_hint;
  if ( !dtype )
    dtype = &tmp_dtype;
  if ( !t )
    t = &tmp_t;
  
  if ( c == ON::continuity::C0_continuous )
    return false;
  if ( c == ON::continuity::C0_locus_continuous )
  {
    return ON_Curve::GetNextDiscontinuity( c, t0, t1, t, hint, dtype, 
                                    cos_angle_tolerance, curvature_tolerance );
  }
  if ( t0 == t1 )
    return false;

  // First test for parametric discontinuities.  If none are found
  // then we will look for locus discontinuities at ends
  if ( m_order <= 2 )
    c = ON::PolylineContinuity((int)c); // no need to check 2nd derivatives that are zero
  const ON::continuity input_c = c;
  c = ON::ParametricContinuity((int)c);
  bool bEv2ndDer    = (c == ON::continuity::C2_continuous || c == ON::continuity::G2_continuous || c == ON::continuity::Gsmooth_continuous) && (m_order>2);
  bool bTestKappa   = ( bEv2ndDer && c != ON::continuity::C2_continuous );
  bool bTestTangent = ( bTestKappa || c == ON::continuity::G1_continuous );

  int delta_ki = 1;
  int delta = ((bEv2ndDer) ? 3 : 2) - m_order; // delta <= 0
  if ( ON::continuity::Cinfinity_continuous == c )
    delta = 0;

  ki = ON_NurbsSpanIndex(m_order,m_cv_count,m_knot,t0,(t0>t1)?-1:1,*hint);
  double segtol = (fabs(m_knot[ki]) + fabs(m_knot[ki+1]) + fabs(m_knot[ki+1]-m_knot[ki]))*ON_SQRT_EPSILON;

  const bool bLineWiggleTest = (c == ON::continuity::Gsmooth_continuous && m_order >= 4);
  bool bSpanIsLinear = false;

  if ( t0 < t1 )
  {
    int ii = ki+m_order-2;
    if ( t0 < m_knot[ii+1] && t1 > m_knot[ii+1] && (m_knot[ii+1]-t0) <= segtol && ii+2 < m_cv_count )
    {
      t0 = m_knot[ii+1];
      ki = ON_NurbsSpanIndex(m_order,m_cv_count,m_knot,t0,1,*hint);
    }
    if ( bLineWiggleTest )
      bSpanIsLinear = SpanIsLinear(ki,is_linear_min_length,is_linear_tolerance);
    *hint = ki;
    ki += m_order-2;
    while (ki < m_cv_count-1 && m_knot[ki] <= t0) 
      ki++;
    if (ki >= m_cv_count-1) 
    {
      if ( input_c != c && t0 < m_knot[m_cv_count-1] && t1 >= m_knot[m_cv_count-1] )
      {
        // have to do locus end test
        return ON_Curve::GetNextDiscontinuity( input_c, t0, t1, t, hint, dtype, 
                                    cos_angle_tolerance, curvature_tolerance );
      }
      return false;
    }
  }
  else
  {
    // (t0 > t1) work backwards
    int ii = ki+m_order-2;
    if ( t0 > m_knot[ii] && t1 < m_knot[ii] && (t0-m_knot[ii]) <= segtol && ii > m_order-2 )
    {
      t0 = m_knot[ii];
      ki = ON_NurbsSpanIndex(m_order,m_cv_count,m_knot,t0,-1,*hint);
    }
    if ( bLineWiggleTest )
      bSpanIsLinear = SpanIsLinear(ki,is_linear_min_length,is_linear_tolerance);
    *hint = ki;
    ki += m_order-2;
    while (ki > m_order-2 && m_knot[ki] >= t0) 
      ki--;
    if (ki <= m_order-2) 
    {
      if ( input_c != c && t0 > m_knot[m_order-2] && t1 < m_knot[m_order-2] )
      {
        // have to do locus end test
        return ON_Curve::GetNextDiscontinuity( input_c, t0, t1, t, hint, dtype, 
                                    cos_angle_tolerance, curvature_tolerance );
      }
      return false;
    }
    delta_ki = -1;
    delta = -delta;
  }

  double search_domain[2];
  if ( t0 <= t1 )
  {
    search_domain[0] = t0;
    search_domain[1] = t1;
  }
  else
  {
    search_domain[0] = t1;
    search_domain[1] = t0;
  }

  while ( search_domain[0] < m_knot[ki] && m_knot[ki] < search_domain[1] ) 
  {
    if ( delta_ki > 0 )
    {
      // t0 < t1 case
      while (ki < m_cv_count-1 && m_knot[ki] == m_knot[ki+1])
        ki++;
      if (ki >= m_cv_count-1) 
        break;    
    }
    else
    {
      // t0 > t1 case
      // 20 March 2003 Dale Lear:
      //     Added to make t0 > t1 case work
      while (ki > m_order-2 && m_knot[ki] == m_knot[ki-1])
        ki--;
      if (ki <= m_order-2) 
        break;    
    }

    if (m_knot[ki] == m_knot[ki+delta]) 
    {  
      if ( ON::continuity::Cinfinity_continuous == c )
      {
        // Cinfinity_continuous is treated as asking for the next knot
        *dtype = 3;
        *t = m_knot[ki];
        return true;
      }

      if ( bEv2ndDer ) {
        Ev2Der( m_knot[ki], Pm, D1m, D2m, -1, hint );
        Ev2Der( m_knot[ki], Pp, D1p, D2p,  1, hint );
      }
      else {
        Ev1Der( m_knot[ki], Pm, D1m, -1, hint );
        Ev1Der( m_knot[ki], Pp, D1p,  1, hint );
      }

      if ( bTestTangent )
      {
        if ( bTestKappa )
        {
          ON_EvCurvature( D1m, D2m, Tm, Km );
          ON_EvCurvature( D1p, D2p, Tp, Kp );
        }
        else
        {
          Tm = D1m;
          Tp = D1p;
          Tm.Unitize();
          Tp.Unitize();
        }
        
        d = Tm*Tp;
        if ( d < cos_angle_tolerance )
        {
          *dtype = 1;
          *t = m_knot[ki];
          return true;
        }
        
        if ( bTestKappa )
        {
          bool bIsCurvatureContinuous = ( ON::continuity::Gsmooth_continuous == c )
                  ? ON_IsGsmoothCurvatureContinuous( Km, Kp, cos_angle_tolerance, curvature_tolerance )
                  : ON_IsG2CurvatureContinuous( Km, Kp, cos_angle_tolerance, curvature_tolerance );
          if ( bIsCurvatureContinuous && ON::continuity::Gsmooth_continuous == c )
          {
            if ( ON_NurbsArcToArcTransitionIsNotGsmooth(*this,ki,cos_angle_tolerance,curvature_tolerance) )
              bIsCurvatureContinuous = false;
          }

          if ( !bIsCurvatureContinuous )
          {
            // NOTE:
            //   The test to enter this scope must exactly match
            //   the one used in ON_PolyCurve::GetNextDiscontinuity()
            //   and  ON_Curve::GetNextDiscontinuity().
            *dtype = 2;
            *t = m_knot[ki];
            return true;
          }
          if ( bLineWiggleTest )
          {
            if ( bSpanIsLinear != (( delta_ki < 0 )
                                  ? SpanIsLinear(ki - m_order + 1,is_linear_min_length,is_linear_tolerance)
                                  : SpanIsLinear(ki - m_order + 2,is_linear_min_length,is_linear_tolerance))
               )
            {
              // we are at a transition between a line segment and a wiggle
              *dtype = 3;
              *t = m_knot[ki];
              return true;
            }
          }
        }
      }
      else
      {
        if ( !(D1m-D1p).IsTiny(D1m.MaximumCoordinate()*ON_SQRT_EPSILON) )
        {
          *dtype = 1;
          *t = m_knot[ki];
          return true;
        }
        else if ( bEv2ndDer )
        {
          if ( !(D2m-D2p).IsTiny(D2m.MaximumCoordinate()*ON_SQRT_EPSILON) )
          {
            *dtype = 2;
            *t = m_knot[ki];
            return true;
          }         
        }
      }
    }
    ki += delta_ki;
  }

  // 20 March 2003 Dale Lear:
  //   If we get here, there are not discontinuities strictly between
  //   t0 and t1.
  bool rc = false;

  if ( input_c != c )
  {
    // use base class for consistent start/end locus testing 
    rc = ON_Curve::GetNextDiscontinuity( input_c, t0, t1, t, hint, dtype, 
                                    cos_angle_tolerance, curvature_tolerance );
  }

  return rc;
}